

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  sockaddr_in6 *src_addr6;
  sockaddr_in *src_addr4;
  sockaddr_storage src_addr;
  sockaddr_in6 *mcast_addr6;
  sockaddr_in *mcast_addr4;
  sockaddr_storage mcast_addr;
  int err;
  uv_membership membership_local;
  char *source_addr_local;
  char *interface_addr_local;
  char *multicast_addr_local;
  uv_udp_t *handle_local;
  
  src_addr.__ss_align = (unsigned_long)&mcast_addr4;
  mcast_addr.__ss_align._4_4_ = membership;
  mcast_addr.__ss_align._0_4_ = uv_ip4_addr(multicast_addr,0,(sockaddr_in *)&mcast_addr4);
  if ((int)mcast_addr.__ss_align == 0) {
    mcast_addr.__ss_align._0_4_ = uv_ip4_addr(source_addr,0,(sockaddr_in *)&src_addr4);
    handle_local._4_4_ = (int)mcast_addr.__ss_align;
    if ((int)mcast_addr.__ss_align == 0) {
      handle_local._4_4_ =
           uv__udp_set_source_membership4
                     (handle,(sockaddr_in *)&mcast_addr4,interface_addr,(sockaddr_in *)&src_addr4,
                      mcast_addr.__ss_align._4_4_);
    }
  }
  else {
    mcast_addr.__ss_align._0_4_ = uv_ip6_addr(multicast_addr,0,(sockaddr_in6 *)src_addr.__ss_align);
    handle_local._4_4_ = (int)mcast_addr.__ss_align;
    if (((int)mcast_addr.__ss_align == 0) &&
       (mcast_addr.__ss_align._0_4_ = uv_ip6_addr(source_addr,0,(sockaddr_in6 *)&src_addr4),
       handle_local._4_4_ = (int)mcast_addr.__ss_align, (int)mcast_addr.__ss_align == 0)) {
      handle_local._4_4_ =
           uv__udp_set_source_membership6
                     (handle,(sockaddr_in6 *)src_addr.__ss_align,interface_addr,
                      (sockaddr_in6 *)&src_addr4,mcast_addr.__ss_align._4_4_);
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) && !defined(__NetBSD__) && !defined(__ANDROID__)
  int err;
  struct sockaddr_storage mcast_addr;
  struct sockaddr_in* mcast_addr4;
  struct sockaddr_in6* mcast_addr6;
  struct sockaddr_storage src_addr;
  struct sockaddr_in* src_addr4;
  struct sockaddr_in6* src_addr6;

  mcast_addr4 = (struct sockaddr_in*)&mcast_addr;
  mcast_addr6 = (struct sockaddr_in6*)&mcast_addr;
  src_addr4 = (struct sockaddr_in*)&src_addr;
  src_addr6 = (struct sockaddr_in6*)&src_addr;

  err = uv_ip4_addr(multicast_addr, 0, mcast_addr4);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, mcast_addr6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, src_addr6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          mcast_addr6,
                                          interface_addr,
                                          src_addr6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, src_addr4);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        mcast_addr4,
                                        interface_addr,
                                        src_addr4,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}